

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::xyResolution
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,
          double xPos_mm,double yPos_mm,double A_top)

{
  VDetector *this_00;
  uint uVar1;
  reference pvVar2;
  RandomGen *pRVar3;
  ostream *poVar4;
  int __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double __value;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_90;
  double sigmaY;
  double sigmaX;
  double phi;
  double sigmaR;
  double kappa;
  double rad;
  allocator<double> local_32;
  undefined1 local_31;
  double local_30;
  double A_top_local;
  double yPos_mm_local;
  double xPos_mm_local;
  NESTcalc *this_local;
  vector<double,_std::allocator<double>_> *xySmeared;
  
  local_31 = 0;
  local_30 = A_top;
  A_top_local = yPos_mm;
  yPos_mm_local = xPos_mm;
  xPos_mm_local = (double)this;
  this_local = (NESTcalc *)__return_storage_ptr__;
  std::allocator<double>::allocator(&local_32);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,2,&local_32);
  std::allocator<double>::~allocator(&local_32);
  dVar7 = yPos_mm_local;
  dVar6 = A_top_local;
  this_00 = this->fdetector;
  dVar5 = VDetector::get_TopDrift(this_00);
  (*this_00->_vptr_VDetector[7])(dVar7,dVar6,dVar5 * 0.5,&rad);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&rad,1);
  local_30 = local_30 * (1.0 - *pvVar2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&rad);
  dVar6 = pow(yPos_mm_local,2.0);
  dVar7 = pow(A_top_local,2.0);
  dVar6 = sqrt(dVar6 + dVar7);
  dVar7 = VDetector::get_PosResBase(this->fdetector);
  dVar5 = VDetector::get_PosResExp(this->fdetector);
  dVar5 = exp(dVar5 * dVar6);
  sigmaR = dVar7 + dVar5;
  if (150.0 < dVar6) {
    sigmaR = 116.0;
  }
  dVar6 = sqrt(local_30);
  dVar6 = sqrt((sigmaR / dVar6) * (sigmaR / dVar6) + 9.0);
  pRVar3 = RandomGen::rndm();
  dVar7 = RandomGen::rand_uniform(pRVar3);
  pRVar3 = RandomGen::rndm();
  RandomGen::rand_gauss(pRVar3,0.0,dVar6,false);
  __x = (int)pRVar3;
  std::abs(__x);
  dVar6 = cos(dVar7 * 6.283185307179586);
  sigmaY = __value * dVar6;
  local_90 = sin(dVar7 * 6.283185307179586);
  local_90 = __value * local_90;
  if (((((100.0 < __value) || (uVar1 = std::isnan(__value), (uVar1 & 1) != 0)) || (__value <= 0.0))
      || ((std::abs(__x), 100.0 < extraout_XMM0_Qa || (std::abs(__x), 100.0 < extraout_XMM0_Qa_00)))
      ) && (40.0 < local_30)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "WARNING: your position resolution is worse than 10 cm. Is that correct?!"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Setting resolution to perfect, for the current event.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    sigmaY = 0.0;
    local_90 = 0.0;
  }
  dVar6 = yPos_mm_local + sigmaY;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar2 = dVar6;
  local_90 = A_top_local + local_90;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  *pvVar2 = local_90;
  return __return_storage_ptr__;
}

Assistant:

vector<double> NESTcalc::xyResolution(double xPos_mm, double yPos_mm,
                                      double A_top) {
  vector<double> xySmeared(2);
  A_top *= 1. - fdetector->FitTBA(xPos_mm, yPos_mm,
                                  fdetector->get_TopDrift() / 2.)[1];

  double rad = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));
  double kappa = fdetector->get_PosResBase() +
                 exp(fdetector->get_PosResExp() * rad);  // arXiv:1710.02752
  if (rad > 150.)
    kappa = 116.;  // see git issue #131 from Claudio: but, converted from cm to
                   // mm here
  double sigmaR = kappa / sqrt(A_top);  // ibid. But only stat; add syst (~3mm)
  sigmaR = sqrt(sigmaR * sigmaR +
                9.);  // σ_vertex^2 = ((r_vertex/r_S2)*σ_(x,y))^2 + σ_sys^2

  double phi = two_PI * RandomGen::rndm()->rand_uniform();
  sigmaR = std::abs(RandomGen::rndm()->rand_gauss(0.0, sigmaR, false));
  double sigmaX = sigmaR * cos(phi);
  double sigmaY = sigmaR * sin(phi);

  if (sigmaR > 1e2 || std::isnan(sigmaR) || sigmaR <= 0. ||
      std::abs(sigmaX) > 1e2 || std::abs(sigmaY) > 1e2) {
    if (A_top >
        40.) {  // roughly three S2 e-'s in most detectors (or ~1.5 in LZ)
      cerr << "WARNING: your position resolution is worse than 10 cm. Is that "
              "correct?!"
           << endl;
      cerr << "Setting resolution to perfect, for the current event." << endl;
      sigmaX = 0.;
      sigmaY = 0.;
    }  // this is only a problem if the area is large and the res is still bad
  }

  xySmeared[0] = xPos_mm + sigmaX;
  xySmeared[1] = yPos_mm + sigmaY;

  return xySmeared;  // new X and Y position in mm with empirical smearing. LUX
                     // Run03 example
}